

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerApp::EnableJoiner
          (Error *__return_storage_ptr__,CommissionerApp *this,JoinerType aType,uint64_t aEui64,
          string *aPSKd,string *aProvisioningUrl)

{
  string *this_00;
  ErrorCode EVar1;
  element_type *peVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  const_iterator cVar7;
  pointer *__dest;
  ushort uVar8;
  ByteArray *this_01;
  ulong uVar9;
  size_t sVar10;
  bool bVar11;
  string_view fmt;
  format_args args;
  format_args args_00;
  ByteArray joinerId;
  writer write;
  ByteArray local_168;
  undefined1 local_150 [8];
  pointer *local_148;
  pointer *ppuStack_140;
  pointer local_138 [2];
  undefined1 local_128 [8];
  _Alloc_hider local_120;
  _Alloc_hider _Stack_118;
  undefined1 local_110 [16];
  code *local_100;
  _Alloc_hider local_f8;
  undefined1 local_e8 [24];
  _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>,std::_Select1st<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>,std::less<ot::commissioner::CommissionerApp::JoinerKey>,std::allocator<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>>
  *local_d0;
  char *local_c8;
  string *local_c0;
  string local_b8;
  string *local_98;
  CommissionerDataset local_90;
  writer local_38;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_c8 = (char *)aEui64;
  local_c0 = aPSKd;
  local_98 = aProvisioningUrl;
  Commissioner::ComputeJoinerId(&local_168,aEui64);
  local_90.mBorderAgentLocator = (this->mCommDataset).mBorderAgentLocator;
  local_90.mSessionId = (this->mCommDataset).mSessionId;
  this_01 = &local_90.mSteeringData;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (this_01,&(this->mCommDataset).mSteeringData);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_90.mAeSteeringData,&(this->mCommDataset).mAeSteeringData);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_90.mNmkpSteeringData,&(this->mCommDataset).mNmkpSteeringData);
  uVar9._0_2_ = (this->mCommDataset).mJoinerUdpPort;
  uVar9._2_2_ = (this->mCommDataset).mAeUdpPort;
  uVar9._4_2_ = (this->mCommDataset).mNmkpUdpPort;
  uVar9._6_2_ = (this->mCommDataset).mPresentFlags;
  local_90._80_8_ = uVar9 & 0x3fffffffffffffff;
  if (aType == kMeshCoP) {
    uVar8 = 0x2000;
  }
  else if (aType == kNMKP) {
    uVar8 = 0x800;
    this_01 = &local_90.mNmkpSteeringData;
  }
  else {
    if (aType != kAE) {
      abort();
    }
    uVar8 = 0x1000;
    this_01 = &local_90.mAeSteeringData;
  }
  local_90.mPresentFlags = uVar9._6_2_ & 0x3fff | uVar8;
  if (aType == kMeshCoP) {
    ValidatePSKd((Error *)local_128,local_c0);
    __return_storage_ptr__->mCode = local_128._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_120);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_120._M_p != local_110) {
      operator_delete(local_120._M_p);
    }
    if (EVar1 != kNone) goto LAB_00162733;
  }
  iVar4 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar4 == '\0') {
    local_128 = (undefined1  [8])((ulong)(uint)local_128._4_4_ << 0x20);
    local_120._M_p = "the commissioner is not active";
    _Stack_118._M_p = (char *)0x1e;
    local_110._0_8_ = (char *)0x0;
    local_100 = (parse_func)0x0;
    pcVar5 = "the commissioner is not active";
    local_110._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_128;
    do {
      pcVar6 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",(format_string_checker<char> *)local_128);
      }
      pcVar5 = pcVar6;
    } while (pcVar6 != "");
    args.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                    )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                      )aProvisioningUrl;
    args.desc_ = (unsigned_long_long)local_128;
    ::fmt::v10::vformat_abi_cxx11_(&local_b8,(v10 *)0x233cbc,(string_view)ZEXT816(0x1e),args);
    local_150._0_4_ = 0xf;
    local_148 = local_138;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
LAB_001626fa:
    __return_storage_ptr__->mCode = local_150._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_148);
    if (local_148 != local_138) {
      operator_delete(local_148);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) goto LAB_00162733;
  }
  else {
    local_128._0_4_ = aType;
    local_120._M_p = (char *)0x0;
    _Stack_118._M_p = (pointer)0x0;
    local_110._0_8_ = 0;
    uVar9 = (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      pcVar5 = (char *)0x0;
    }
    else {
      if ((long)uVar9 < 0) {
        std::__throw_bad_alloc();
      }
      pcVar5 = (char *)operator_new(uVar9);
    }
    local_d0 = (_Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>,std::_Select1st<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>,std::less<ot::commissioner::CommissionerApp::JoinerKey>,std::allocator<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>>
                *)&this->mJoiners;
    local_110._0_8_ = pcVar5 + uVar9;
    sVar10 = (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    local_120._M_p = pcVar5;
    if (sVar10 != 0) {
      _Stack_118._M_p = pcVar5;
      memmove(pcVar5,local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar10);
    }
    _Stack_118._M_p = pcVar5 + sVar10;
    cVar7 = std::
            _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,_std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>,_std::_Select1st<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
            ::find((_Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,_std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>,_std::_Select1st<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
                    *)local_d0,(key_type *)local_128);
    if (local_120._M_p != (char *)0x0) {
      operator_delete(local_120._M_p);
    }
    if ((_Rb_tree_header *)cVar7._M_node != &(this->mJoiners)._M_t._M_impl.super__Rb_tree_header) {
      local_128._0_4_ = int_type;
      local_128._4_4_ = ulong_long_type;
      pcVar5 = "joiner(type={}, EUI64={:X}) has already been enabled";
      local_120._M_p = "joiner(type={}, EUI64={:X}) has already been enabled";
      _Stack_118._M_p = (pointer)0x34;
      local_110._0_8_ = (char *)0x200000000;
      local_100 = ::fmt::v10::detail::
                  parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
      local_f8._M_p =
           (pointer)::fmt::v10::detail::
                    parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      local_110._8_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_128;
      local_38.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_128;
      do {
        if (pcVar5 == "") break;
        pcVar6 = pcVar5;
        if (*pcVar5 == '{') {
LAB_0016265d:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int,_unsigned_long>_>
          ::writer::operator()(&local_38,pcVar5,pcVar6);
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int,unsigned_long>&>
                             (pcVar6,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_128);
          bVar11 = true;
        }
        else {
          pcVar6 = pcVar5 + 1;
          bVar11 = pcVar6 != "";
          if (bVar11) {
            if (*pcVar6 != '{') {
              pcVar3 = pcVar5 + 2;
              do {
                pcVar6 = pcVar3;
                bVar11 = pcVar6 != "";
                if (pcVar6 == "") goto LAB_00162659;
                pcVar3 = pcVar6 + 1;
              } while (*pcVar6 != '{');
            }
            bVar11 = true;
          }
LAB_00162659:
          if (bVar11) goto LAB_0016265d;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int,_unsigned_long>_>
          ::writer::operator()(&local_38,pcVar5,"");
          bVar11 = false;
        }
      } while (bVar11);
      local_128._4_4_ = none_type;
      local_128._0_4_ = aType;
      _Stack_118._M_p = local_c8;
      fmt.size_ = 0x41;
      fmt.data_ = (char *)0x34;
      args_00.field_1 =
           (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )aProvisioningUrl;
      args_00.desc_ = (unsigned_long_long)local_128;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b8,(v10 *)"joiner(type={}, EUI64={:X}) has already been enabled",fmt,args_00
                );
      local_150._0_4_ = 0xd;
      local_148 = local_138;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,local_b8._M_dataplus._M_p,
                 local_b8._M_dataplus._M_p + local_b8._M_string_length);
      goto LAB_001626fa;
    }
    Commissioner::AddJoiner(this_01,&local_168);
    peVar2 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Commissioner[0x14])(local_128,peVar2,&local_90);
    __return_storage_ptr__->mCode = local_128._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_120);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_120._M_p != local_110) {
      operator_delete(local_120._M_p);
    }
    if (EVar1 != kNone) goto LAB_00162733;
    MergeDataset(&this->mCommDataset,&local_90);
    local_148 = (pointer *)0x0;
    ppuStack_140 = (pointer *)0x0;
    local_138[0] = (pointer)0x0;
    uVar9 = (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_150._0_4_ = aType;
    if (uVar9 == 0) {
      __dest = (pointer *)0x0;
    }
    else {
      if ((long)uVar9 < 0) {
        std::__throw_bad_alloc();
      }
      __dest = (pointer *)operator_new(uVar9);
    }
    local_138[0] = (pointer)((long)__dest + uVar9);
    sVar10 = (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    local_148 = __dest;
    if (sVar10 != 0) {
      ppuStack_140 = __dest;
      memmove(__dest,local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar10);
    }
    ppuStack_140 = (pointer *)((long)__dest + sVar10);
    JoinerInfo::JoinerInfo((JoinerInfo *)local_128,aType,(uint64_t)local_c8,local_c0,local_98);
    std::
    _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>,std::_Select1st<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>,std::less<ot::commissioner::CommissionerApp::JoinerKey>,std::allocator<std::pair<ot::commissioner::CommissionerApp::JoinerKey_const,ot::commissioner::JoinerInfo>>>
    ::_M_emplace_unique<ot::commissioner::CommissionerApp::JoinerKey,ot::commissioner::JoinerInfo>
              (local_d0,(JoinerKey *)local_150,(JoinerInfo *)local_128);
    if (local_f8._M_p != local_e8) {
      operator_delete(local_f8._M_p);
    }
    if (_Stack_118._M_p != local_110 + 8) {
      operator_delete(_Stack_118._M_p);
    }
    local_b8._M_dataplus._M_p = (pointer)local_148;
    if (local_148 == (pointer *)0x0) goto LAB_00162733;
  }
  operator_delete(local_b8._M_dataplus._M_p);
LAB_00162733:
  if (local_90.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.mNmkpSteeringData.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.mAeSteeringData.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.mSteeringData.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::EnableJoiner(JoinerType         aType,
                                    uint64_t           aEui64,
                                    const std::string &aPSKd,
                                    const std::string &aProvisioningUrl)
{
    Error error;
    auto  joinerId    = Commissioner::ComputeJoinerId(aEui64);
    auto  commDataset = mCommDataset;
    commDataset.mPresentFlags &= ~CommissionerDataset::kSessionIdBit;
    commDataset.mPresentFlags &= ~CommissionerDataset::kBorderAgentLocatorBit;
    auto &steeringData = GetSteeringData(commDataset, aType);

    if (aType == JoinerType::kMeshCoP)
    {
        SuccessOrExit(error = ValidatePSKd(aPSKd));
    }

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    VerifyOrExit(mJoiners.count({aType, joinerId}) == 0,
                 error = ERROR_ALREADY_EXISTS("joiner(type={}, EUI64={:X}) has already been enabled",
                                              utils::to_underlying(aType), aEui64));

    Commissioner::AddJoiner(steeringData, joinerId);
    SuccessOrExit(error = mCommissioner->SetCommissionerDataset(commDataset));

    MergeDataset(mCommDataset, commDataset);
    mJoiners.emplace(JoinerKey{aType, joinerId}, JoinerInfo{aType, aEui64, aPSKd, aProvisioningUrl});

exit:
    return error;
}